

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

short testinator::detail::Arbitrary_Arithmetic<short>::generate
                (size_t generation,unsigned_long randomSeed)

{
  short sVar1;
  short sVar2;
  TestRegistry *this;
  uniform_int_distribution<short> local_2c;
  mt19937 *pmStack_28;
  uniform_int_distribution<short> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation == 0) {
    generation_local._6_2_ = 0;
  }
  else if (generation == 1) {
    generation_local._6_2_ = ::std::numeric_limits<short>::min();
  }
  else if (generation == 2) {
    generation_local._6_2_ = ::std::numeric_limits<short>::max();
  }
  else {
    this = GetTestRegistry();
    pmStack_28 = TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(pmStack_28,randomSeed);
    sVar1 = ::std::numeric_limits<short>::min();
    sVar2 = ::std::numeric_limits<short>::max();
    ::std::uniform_int_distribution<short>::uniform_int_distribution(&local_2c,sVar1 + 1,sVar2 + -1)
    ;
    generation_local._6_2_ =
         ::std::uniform_int_distribution<short>::operator()(&local_2c,pmStack_28);
  }
  return generation_local._6_2_;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_int_distribution<T> dis(
                std::numeric_limits<T>::min() + 1, std::numeric_limits<T>::max() - 1);
            return dis(gen);
          }
        }
      }